

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packingvectors.h
# Opt level: O2

uint32_t *
FastPForLib::packingvector<32U>::unpackmetight<unsigned_int>
          (uint32_t *in,uint *out,size_t outSize,uint32_t bit)

{
  ulong uVar1;
  uint uVar2;
  uint32_t *in_00;
  int iVar3;
  uint uVar4;
  uint32_t *in_01;
  ulong uVar5;
  uint32_t buffer [64];
  uint32_t local_138 [66];
  
  uVar4 = *in;
  uVar1 = (ulong)bit;
  in_01 = in + 1;
  iVar3 = uVar4 * bit;
  for (uVar2 = 0; uVar5 = (ulong)uVar2, uVar2 + 0x1f < uVar4; uVar2 = uVar2 + 0x20) {
    fastunpack(in_01,out + uVar5,bit);
    in_01 = in_01 + uVar1;
    iVar3 = iVar3 + bit * -0x20;
  }
  in_00 = local_138;
  memcpy(in_00,in_01,(ulong)(iVar3 + 0x1fU >> 3 & 0xfffffffc));
  uVar4 = -iVar3;
  for (; uVar2 != outSize; uVar2 = uVar2 + 0x20) {
    fastunpack(in_00,out + uVar2,bit);
    in_00 = in_00 + uVar1;
    uVar4 = uVar4 + bit * 0x20;
  }
  return (uint32_t *)
         ((long)in_01 + (uVar1 * (outSize - uVar5 >> 5) * 4 - (ulong)((uVar4 >> 5) << 2)));
}

Assistant:

static const uint32_t *unpackmetight(
                                       const uint32_t *in,
                                       IntType * out,
                                       size_t outSize,
                                       const uint32_t bit) {
    const uint32_t size = *in;
    ++in;
    uint32_t j = 0;
    for (; j + PACKSIZE - 1 < size; j += PACKSIZE) {
      fastunpack(in, &out[j], bit);
      in += bit;
    }
    uint32_t buffer[PACKSIZE * 2];
    uint32_t remaining = size - j;
    memcpy(buffer, in, (remaining * bit + 31) / 32 * sizeof(uint32_t));
    uint32_t *bpointer = buffer;
    in += (outSize - j) / PACKSIZE * bit;
    for (; j != outSize; j += PACKSIZE) {
      fastunpack(bpointer, &out[j], bit);
      bpointer += bit;
    }
    in -= (j - size) * bit / 32;
    return in;
  }